

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateParsingCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableEnumOneofFieldGenerator *this_local;
  
  descriptor = FieldDescriptor::file((this->super_ImmutableEnumFieldGenerator).descriptor_);
  bVar1 = SupportUnknownEnumValue(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,
                       "int rawValue = input.readEnum();\n$set_oneof_case_message$;\n$oneof_name$_ = rawValue;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,
                       "int rawValue = input.readEnum();\n@SuppressWarnings(\"deprecation\")\n$type$ value = $type$.$for_number$(rawValue);\nif (value == null) {\n  unknownFields.mergeVarintField($number$, rawValue);\n} else {\n  $set_oneof_case_message$;\n  $oneof_name$_ = rawValue;\n}\n"
                      );
  }
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "$set_oneof_case_message$;\n"
                   "$oneof_name$_ = rawValue;\n");
  } else {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "@SuppressWarnings(\"deprecation\")\n"
                   "$type$ value = $type$.$for_number$(rawValue);\n"
                   "if (value == null) {\n"
                   "  unknownFields.mergeVarintField($number$, rawValue);\n"
                   "} else {\n"
                   "  $set_oneof_case_message$;\n"
                   "  $oneof_name$_ = rawValue;\n"
                   "}\n");
  }
}